

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapCool(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  
  uVar5 = (ulong)(uint)h;
  iVar2 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar2 == 0) {
    lVar4 = (long)w;
    lVar3 = 0;
    if (0 < lVar4) {
      lVar3 = lVar4;
    }
    if (h < 1) {
      uVar5 = 0;
    }
    piVar6 = out + lVar4 + 4;
    piVar7 = out + lVar4 * 2 + 5;
    uVar10 = 0;
    piVar9 = out;
    while (uVar10 != uVar5) {
      uVar10 = uVar10 + 1;
      for (lVar8 = 0; lVar3 * 4 != lVar8; lVar8 = lVar8 + 4) {
        iVar2 = *(int *)((long)piVar6 + lVar8 + -4);
        if ((iVar2 == 1) &&
           (((((iVar2 = *(int *)((long)piVar9 + lVar8 + 4), iVar2 == 3 ||
               (*(int *)((long)piVar6 + lVar8) == 3)) ||
              (iVar1 = *(int *)((long)piVar6 + lVar8 + -8), iVar1 == 3)) ||
             ((*(int *)((long)piVar7 + lVar8) == 3 || (iVar2 == 4)))) ||
            ((*(int *)((long)piVar6 + lVar8) == 4 ||
             ((iVar1 == 4 || (iVar2 = 1, *(int *)((long)piVar7 + lVar8) == 4)))))))) {
          iVar2 = 2;
        }
        *(int *)((long)out + lVar8) = iVar2;
      }
      out = out + lVar4;
      piVar6 = piVar6 + lVar4 + 2;
      piVar7 = piVar7 + lVar4 + 2;
      piVar9 = piVar9 + lVar4 + 2;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapCool(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];

            if (v11 == Warm)
            {
                int v10 = out[i+1 + (j+0)*pW];
                int v21 = out[i+2 + (j+1)*pW];
                int v01 = out[i+0 + (j+1)*pW];
                int v12 = out[i+1 + (j+2)*pW];

                if (isAny4(Cold, v10, v21, v01, v12) || isAny4(Freezing, v10, v21, v01, v12))
                {
                    v11 = Lush;
                }
            }

            out[i + j*w] = v11;
        }
    }

    return 0;
}